

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_schema_info.cpp
# Opt level: O3

string * __thiscall
duckdb::CreateSchemaInfo::ToString_abi_cxx11_(string *__return_storage_ptr__,CreateSchemaInfo *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  size_type *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string qualified;
  string local_88;
  string local_68;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,anon_var_dwarf_63f17de + 9);
  paVar6 = &local_88.field_2;
  if ((this->super_CreateInfo).temporary == true) {
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,anon_var_dwarf_63f17de + 9);
  }
  else {
    pcVar2 = (this->super_CreateInfo).catalog._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)paVar6;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar2,pcVar2 + (this->super_CreateInfo).catalog._M_string_length
              );
  }
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,anon_var_dwarf_63f17de + 9);
  ParseInfo::QualifierToString(&local_48,&local_88,&local_68,&(this->super_CreateInfo).schema);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar6) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  switch((this->super_CreateInfo).on_conflict) {
  case ERROR_ON_CONFLICT:
    ::std::operator+(&local_68,"CREATE SCHEMA ",&local_48);
    plVar3 = (long *)::std::__cxx11::string::append((char *)&local_68);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88.field_2._8_8_ = plVar3[3];
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_88._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
    break;
  case IGNORE_ON_CONFLICT:
    ::std::operator+(&local_68,"CREATE SCHEMA IF NOT EXISTS ",&local_48);
    puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_68);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88.field_2._8_8_ = puVar4[3];
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_88._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
    break;
  case REPLACE_ON_CONFLICT:
    ::std::operator+(&local_68,"CREATE OR REPLACE SCHEMA ",&local_48);
    puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_68);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88.field_2._8_8_ = puVar4[3];
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88._M_dataplus._M_p = (pointer)*puVar4;
    }
    local_88._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    ::std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)local_88._M_dataplus._M_p);
    break;
  case ALTER_ON_CONFLICT:
    ::std::operator+(&local_68,"CREATE SCHEMA ",&local_48);
    puVar4 = (undefined8 *)::std::__cxx11::string::append((char *)&local_68);
    psVar5 = puVar4 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_88.field_2._M_allocated_capacity = *psVar5;
      local_88.field_2._8_8_ = puVar4[3];
    }
    else {
      local_88.field_2._M_allocated_capacity = *psVar5;
      paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar4;
    }
    local_88._M_string_length = puVar4[1];
    *puVar4 = psVar5;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    local_88._M_dataplus._M_p = (pointer)paVar6;
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)paVar6);
    break;
  default:
    goto switchD_0076a0b2_default;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p);
  }
switchD_0076a0b2_default:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CreateSchemaInfo::ToString() const {
	string ret = "";
	string qualified = QualifierToString(temporary ? "" : catalog, "", schema);

	switch (on_conflict) {
	case OnCreateConflict::ALTER_ON_CONFLICT: {
		ret += "CREATE SCHEMA " + qualified + " ON CONFLICT INSERT OR REPLACE;";
		break;
	}
	case OnCreateConflict::IGNORE_ON_CONFLICT: {
		ret += "CREATE SCHEMA IF NOT EXISTS " + qualified + ";";
		break;
	}
	case OnCreateConflict::REPLACE_ON_CONFLICT: {
		ret += "CREATE OR REPLACE SCHEMA " + qualified + ";";
		break;
	}
	case OnCreateConflict::ERROR_ON_CONFLICT: {
		ret += "CREATE SCHEMA " + qualified + ";";
		break;
	}
	}
	return ret;
}